

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O0

void on_delivery_settled(void *context,delivery_number delivery_no,
                        LINK_DELIVERY_SETTLE_REASON reason,AMQP_VALUE delivery_state)

{
  MESSAGE_SENDER_INSTANCE *message_sender_00;
  _Bool _Var1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE descriptor_00;
  AMQP_VALUE pAVar3;
  LOGGER_LOG l_1;
  AMQP_VALUE described;
  AMQP_VALUE descriptor;
  LOGGER_LOG l;
  MESSAGE_SENDER_INSTANCE *message_sender;
  MESSAGE_WITH_CALLBACK *message_with_callback;
  ASYNC_OPERATION_HANDLE pending_send;
  AMQP_VALUE delivery_state_local;
  LINK_DELIVERY_SETTLE_REASON reason_local;
  delivery_number delivery_no_local;
  void *context_local;
  
  if ((context != (void *)0xfffffffffffffff8) && (*(long *)((long)context + 0x10) != 0)) {
    message_sender_00 = *(MESSAGE_SENDER_INSTANCE **)((long)context + 0x20);
    switch(reason) {
    case LINK_DELIVERY_SETTLE_REASON_DISPOSITION_RECEIVED:
      if (delivery_state == (AMQP_VALUE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                    ,"on_delivery_settled",0x7a,1,"delivery state not provided");
        }
      }
      else {
        descriptor_00 = amqpvalue_get_inplace_descriptor(delivery_state);
        pAVar3 = amqpvalue_get_inplace_described_value(delivery_state);
        if (descriptor_00 == (AMQP_VALUE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_sender.c"
                      ,"on_delivery_settled",0x83,1,"Error getting descriptor for delivery state");
          }
          (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18),2,pAVar3);
        }
        else {
          _Var1 = is_accepted_type_by_descriptor(descriptor_00);
          if (_Var1) {
            (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18),1,pAVar3);
          }
          else {
            (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18),2,pAVar3);
          }
        }
        remove_pending_message(message_sender_00,(ASYNC_OPERATION_HANDLE)context);
      }
      break;
    case LINK_DELIVERY_SETTLE_REASON_SETTLED:
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18),1,0);
      remove_pending_message(message_sender_00,(ASYNC_OPERATION_HANDLE)context);
      break;
    case LINK_DELIVERY_SETTLE_REASON_NOT_DELIVERED:
    default:
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18),2,0);
      remove_pending_message(message_sender_00,(ASYNC_OPERATION_HANDLE)context);
      break;
    case LINK_DELIVERY_SETTLE_REASON_TIMEOUT:
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18),3,0);
      remove_pending_message(message_sender_00,(ASYNC_OPERATION_HANDLE)context);
      break;
    case LINK_DELIVERY_SETTLE_REASON_CANCELLED:
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18),4,0);
      remove_pending_message(message_sender_00,(ASYNC_OPERATION_HANDLE)context);
    }
  }
  return;
}

Assistant:

static void on_delivery_settled(void* context, delivery_number delivery_no, LINK_DELIVERY_SETTLE_REASON reason, AMQP_VALUE delivery_state)
{
    ASYNC_OPERATION_HANDLE pending_send = (ASYNC_OPERATION_HANDLE)context;
    MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, pending_send);
    (void)delivery_no;

    if (message_with_callback != NULL && 
        message_with_callback->on_message_send_complete != NULL)
    {
        MESSAGE_SENDER_INSTANCE *message_sender = (MESSAGE_SENDER_INSTANCE *)message_with_callback->message_sender;
        switch (reason)
        {
        case LINK_DELIVERY_SETTLE_REASON_DISPOSITION_RECEIVED:
            if (delivery_state == NULL)
            {
                LogError("delivery state not provided");
            }
            else
            {
                AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(delivery_state);
                AMQP_VALUE described = amqpvalue_get_inplace_described_value(delivery_state);

                if (descriptor == NULL)
                {
                    LogError("Error getting descriptor for delivery state");
                    message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_ERROR, described);
                }
                else
                {
                    if (is_accepted_type_by_descriptor(descriptor))
                    {
                        message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_OK, described);
                    }
                    else
                    {
                        message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_ERROR, described);
                    }
                }

                remove_pending_message(message_sender, pending_send);
            }

            break;
        case LINK_DELIVERY_SETTLE_REASON_SETTLED:
            message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_OK, NULL);
            remove_pending_message(message_sender, pending_send);
            break;
        case LINK_DELIVERY_SETTLE_REASON_TIMEOUT:
            message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_TIMEOUT, NULL);
            remove_pending_message(message_sender, pending_send);
            break;
        case LINK_DELIVERY_SETTLE_REASON_CANCELLED:
            message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_CANCELLED, NULL);
            remove_pending_message(message_sender, pending_send);
            break;
        case LINK_DELIVERY_SETTLE_REASON_NOT_DELIVERED:
        default:
            message_with_callback->on_message_send_complete(message_with_callback->context, MESSAGE_SEND_ERROR, NULL);
            remove_pending_message(message_sender, pending_send);
            break;
        }
    }
}